

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

BOOL SetEnvironmentVariableW(LPCWSTR lpName,LPCWSTR lpValue)

{
  int iVar1;
  BOOL local_34;
  BOOL bRet;
  INT valueSize;
  INT nameSize;
  PCHAR value;
  PCHAR name;
  LPCWSTR lpValue_local;
  LPCWSTR lpName_local;
  
  value = (PCHAR)0x0;
  _valueSize = (LPSTR)0x0;
  local_34 = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = WideCharToMultiByte(0,0,lpName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(0x57);
  }
  else {
    value = (PCHAR)PAL_malloc((long)iVar1);
    if (value == (LPSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,lpName,-1,value,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar1 == 0) {
        fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                ,0x123);
        fprintf(_stderr,"WideCharToMultiByte returned 0\n");
        SetLastError(0x54f);
      }
      else {
        if (lpValue != (LPCWSTR)0x0) {
          iVar1 = WideCharToMultiByte(0,0,lpValue,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar1 == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            SetLastError(0x57);
            goto LAB_0015610a;
          }
          _valueSize = (LPSTR)PAL_malloc((long)iVar1);
          if (_valueSize == (LPSTR)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            SetLastError(8);
            goto LAB_0015610a;
          }
          iVar1 = WideCharToMultiByte(0,0,lpValue,-1,_valueSize,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar1 == 0) {
            fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                    ,0x13e);
            fprintf(_stderr,"WideCharToMultiByte failed\n");
            SetLastError(0x54f);
            goto LAB_0015610a;
          }
        }
        local_34 = SetEnvironmentVariableA(value,_valueSize);
      }
    }
  }
LAB_0015610a:
  PAL_free(_valueSize);
  PAL_free(value);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_34;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetEnvironmentVariableW(
            IN LPCWSTR lpName,
            IN LPCWSTR lpValue)
{
    PCHAR name = NULL;
    PCHAR value = NULL;
    INT nameSize = 0;
    INT valueSize = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(SetEnvironmentVariableW);
    ENTRY("SetEnvironmentVariableW(lpName=%p (%S), lpValue=%p (%S))\n",
        lpName?lpName:W16_NULLSTRING,
        lpName?lpName:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING);

    if ((nameSize = WideCharToMultiByte(CP_ACP, 0, lpName, -1, name, 0, 
                                        NULL, NULL)) == 0)
    {
        ERROR("WideCharToMultiByte failed\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    name = (PCHAR)PAL_malloc(sizeof(CHAR)* nameSize);
    if (name == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    
    if ( 0 == WideCharToMultiByte(CP_ACP, 0, lpName,  -1, 
                                  name,  nameSize, NULL, NULL ) )
    {
        ASSERT( "WideCharToMultiByte returned 0\n" );
        SetLastError( ERROR_INTERNAL_ERROR );
        goto done;
    }

    if ( NULL != lpValue )
    {
        if ((valueSize = WideCharToMultiByte(CP_ACP, 0, lpValue, -1, value, 
                                             0, NULL, NULL)) == 0)
        {
            ERROR("WideCharToMultiByte failed\n");
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        value = (PCHAR)PAL_malloc(sizeof(CHAR)*valueSize);
        
        if ( NULL == value )
        {
            ERROR("malloc failed\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        
        if ( 0 == WideCharToMultiByte( CP_ACP, 0, lpValue, -1, 
                                       value, valueSize, NULL, NULL ) )
        {
            ASSERT("WideCharToMultiByte failed\n");
            SetLastError( ERROR_INTERNAL_ERROR );
            goto done;
        }
    }
    

    bRet = SetEnvironmentVariableA(name, value);
done:
    PAL_free(value);
    PAL_free(name);
    
    LOGEXIT("SetEnvironmentVariableW returning BOOL %d\n", bRet);
    PERF_EXIT(SetEnvironmentVariableW);
    return bRet;
}